

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_BnB_Node.cpp
# Opt level: O1

string * __thiscall
BGIP_BnB_Node::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,BGIP_BnB_Node *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"BGIP_BnB_Node[",0xe);
  poVar1 = std::ostream::_M_insert<void_const*>(local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] depth(=nr. spec. jtypes)= ",0x1c);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," F ",3);
  poVar1 = std::ostream::_M_insert<double>(this->_m_g + this->_m_h);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," G ",3);
  poVar1 = std::ostream::_M_insert<double>(this->_m_g);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," H ",3);
  poVar1 = std::ostream::_M_insert<double>(this->_m_h);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," nrAleft ",9);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

string BGIP_BnB_Node::SoftPrint() const 
{
    std::stringstream ss;
    ss << "BGIP_BnB_Node[" << this << "] depth(=nr. spec. jtypes)= " << _m_depth
       << " F " << GetF()
       << " G "
       << _m_g
       << " H "
       << _m_h
       << " nrAleft "
       //<< _m_nrActionsLeftToSpecify
       ;
#if INCR_EXPAND
    ss << " jaExp <";
    for(Index ja=0;ja!=_m_alreadyExpandedJA.size();++ja)
        if(_m_alreadyExpandedJA[ja])
            ss << ja << " ";
    ss << ">";
#endif
    return(ss.str());
}